

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

bool __thiscall
glslang::TSymbolTableLevel::amend(TSymbolTableLevel *this,TSymbol *symbol,int firstNewMember)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*symbol->_vptr_TSymbol[3])(symbol);
  bVar1 = IsAnonymous((TString *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    bVar1 = insertAnonymousMembers(this,symbol,firstNewMember);
    return bVar1;
  }
  return false;
}

Assistant:

bool amend(TSymbol& symbol, int firstNewMember)
    {
        // See insert() for comments on basic explanation of insert.
        // This operates similarly, but more simply.
        // Only supporting amend of anonymous blocks so far.
        if (IsAnonymous(symbol.getName()))
            return insertAnonymousMembers(symbol, firstNewMember);
        else
            return false;
    }